

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_defer(_func_void_void_ptr_void_ptr *func,void *arg1,void *arg2)

{
  fio_defer_task_s task;
  void *arg2_local;
  void *arg1_local;
  _func_void_void_ptr_void_ptr *func_local;
  
  if (func == (_func_void_void_ptr_void_ptr *)0x0) {
    func_local._4_4_ = -1;
  }
  else {
    task.arg1 = arg1;
    task.func = func;
    task.arg2 = arg2;
    fio_defer_push_task_fn(task,&task_queue_normal);
    fio_defer_thread_signal();
    func_local._4_4_ = 0;
  }
  return func_local._4_4_;
}

Assistant:

int fio_defer(void (*func)(void *, void *), void *arg1, void *arg2) {
  /* must have a task to defer */
  if (!func)
    goto call_error;
  fio_defer_push_task(func, arg1, arg2);
  return 0;

call_error:
  return -1;
}